

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator-global.c
# Opt level: O1

int main(void)

{
  char option;
  byte local_39;
  double local_38;
  
  local_39 = 0;
  puts("Hello! Welcome to the CWorkshop Calculator!\n");
  do {
    printf("Valor: %f\n",value);
    puts(
        "\'+\' - Sum; \'-\' - Subtract; \'*\' - Multiply; \'/\' - Divide; \'c\' - Clear; \'e\' - Exit\n"
        );
    printf("OPTION: ");
    __isoc99_scanf(" %c",&local_39);
    switch(local_39) {
    case 0x2a:
      local_38 = 0.0;
      __isoc99_scanf("%lf",&local_38);
      value = local_38 * value;
      break;
    case 0x2b:
      local_38 = 0.0;
      __isoc99_scanf("%lf",&local_38);
      value = local_38 + value;
      break;
    case 0x2c:
    case 0x2e:
      break;
    case 0x2d:
      local_38 = 0.0;
      __isoc99_scanf("%lf",&local_38);
      value = value - local_38;
      break;
    case 0x2f:
      local_38 = 0.0;
      __isoc99_scanf("%lf",&local_38);
      value = value / local_38;
      break;
    default:
      if (local_39 == 99) {
        value = 0.0;
      }
    }
  } while (local_39 != 0x65);
  return 0;
}

Assistant:

int main() {
    char option = 0;

    printf("Hello! Welcome to the CWorkshop Calculator!\n\n");
    do {
    
        printf("Valor: %f\n", value);
       
        printf("'+' - Sum; '-' - Subtract; '*' - Multiply; '/' - Divide; 'c' - Clear; 'e' - Exit\n\n");
        
        printf("OPTION: ");
        scanf(" %c", &option);
        
        switch (option) {
            case '+':
                Sum();
                break;
            case '-':
                Subtract();
                break;
            case '*':
                Multiply();
                break;
            case '/':
                Divide();
                break;
            case 'c':
                Clear();
                break;
            case 'e':
                break;
            default:
                break;
        }
    
    } while(option != 'e');
    
    return 0;
}